

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_compareBaseUnitsAgainstItself_Test::TestBody(Units_compareBaseUnitsAgainstItself_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  UnitsPtr u1;
  long *local_50;
  double local_48;
  long *local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  long local_30 [2];
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Units::create();
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"frufru","");
  libcellml::NamedEntity::setName(local_20);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_50 = (long *)&DAT_3ff0000000000000;
  local_48 = (double)libcellml::Units::scalingFactor
                               ((shared_ptr *)&local_20,(shared_ptr *)&local_20,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_40,"1.0","libcellml::Units::scalingFactor(u1, u1)",
             (double *)&local_50,&local_48);
  if (local_40._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x424,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if (local_50 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_50 != (long *)0x0)) {
        (**(code **)(*local_50 + 8))();
      }
      local_50 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Units, compareBaseUnitsAgainstItself)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("frufru");

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u1));
}